

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O0

void __thiscall helics::tcp::TcpComms::loadNetworkInfo(TcpComms *this,NetworkBrokerData *netInfo)

{
  bool bVar1;
  CommsInterface *in_RSI;
  CommsInterface *in_RDI;
  NetworkBrokerData *in_stack_00000058;
  NetworkCommsInterface *in_stack_00000060;
  CommsInterface *this_00;
  
  this_00 = in_RDI;
  NetworkCommsInterface::loadNetworkInfo(in_stack_00000060,in_stack_00000058);
  bVar1 = CommsInterface::propertyLock(this_00);
  if (bVar1) {
    in_RDI[1].rxTrigger.field_0xa0 = *(byte *)((long)&in_RSI->rxTrigger + 0xad) & 1;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    CommsInterface::propertyUnLock(in_RSI);
  }
  return;
}

Assistant:

void TcpComms::loadNetworkInfo(const NetworkBrokerData& netInfo)
{
    NetworkCommsInterface::loadNetworkInfo(netInfo);
    if (!propertyLock()) {
        return;
    }
    reuse_address = netInfo.reuse_address;
    encryption_config = netInfo.encryptionConfig;
    propertyUnLock();
}